

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O2

void __thiscall
irr::video::COpenGLDriver::COpenGLDriver
          (COpenGLDriver *this,SIrrlichtCreationParameters *params,IFileSystem *io,
          IContextManager *contextManager)

{
  undefined8 *puVar1;
  long lVar2;
  
  *(undefined ***)&this->field_0x10f8 = &PTR__IReferenceCounted_0027ba48;
  *(undefined8 *)&this->field_0x1100 = 0;
  *(undefined4 *)&this->field_0x1108 = 1;
  CNullDriver::CNullDriver
            (&this->super_CNullDriver,&PTR_construction_vtable_24__002811e8,io,&params->WindowSize);
  *(undefined ***)&(this->super_CNullDriver).field_0x490 = &PTR__IMaterialRendererServices_00281aa8;
  COpenGLExtensionHandler::COpenGLExtensionHandler
            ((COpenGLExtensionHandler *)&(this->super_CNullDriver).field_0x498);
  (this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver = (_func_int **)0x280ce8;
  *(undefined8 *)&this->field_0x10f8 = 0x2811d0;
  *(undefined8 *)&(this->super_CNullDriver).super_IVideoDriver.field_0x8 = 0x281118;
  *(undefined8 *)&(this->super_CNullDriver).field_0x490 = 0x281158;
  this->CacheHandler = (COpenGLCacheHandler *)0x0;
  (this->Name).str._M_dataplus._M_p = (pointer)&(this->Name).str.field_2;
  (this->Name).str._M_string_length = 0;
  (this->Name).str.field_2._M_local_buf[0] = '\0';
  lVar2 = 0;
  do {
    puVar1 = (undefined8 *)((long)this->Matrices[0].M + lVar2 + 0x24);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)this->Matrices[0].M + lVar2 + 0x34) = 0;
    puVar1 = (undefined8 *)((long)this->Matrices[0].M + lVar2 + 0x14);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->Matrices[0].M + lVar2 + 4);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)this->Matrices[0].M + lVar2 + 0x3c) = 0x3f800000;
    *(undefined4 *)((long)this->Matrices[0].M + lVar2 + 0x28) = 0x3f800000;
    *(undefined4 *)((long)this->Matrices[0].M + lVar2 + 0x14) = 0x3f800000;
    *(undefined4 *)((long)this->Matrices[0].M + lVar2) = 0x3f800000;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0x1c0);
  (this->ColorBuffer).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ColorBuffer).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ColorBuffer).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ColorBuffer).is_sorted = true;
  this->CurrentRenderMode = ERM_NONE;
  this->ResetRenderStates = true;
  this->Transformation3DChanged = true;
  this->AntiAlias = params->AntiAlias;
  SMaterial::SMaterial(&this->Material);
  SMaterial::SMaterial(&this->LastMaterial);
  (this->UserClipPlanes).m_data.
  super__Vector_base<irr::video::COpenGLDriver::SUserClipPlane,_std::allocator<irr::video::COpenGLDriver::SUserClipPlane>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->UserClipPlanes).m_data.
  super__Vector_base<irr::video::COpenGLDriver::SUserClipPlane,_std::allocator<irr::video::COpenGLDriver::SUserClipPlane>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->UserClipPlanes).m_data.
  super__Vector_base<irr::video::COpenGLDriver::SUserClipPlane,_std::allocator<irr::video::COpenGLDriver::SUserClipPlane>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->UserClipPlanes).is_sorted = true;
  (this->VendorName).str._M_dataplus._M_p = (pointer)&(this->VendorName).str.field_2;
  (this->VendorName).str._M_string_length = 0;
  (this->VendorName).str.field_2._M_local_buf[0] = '\0';
  (this->TextureFlipMatrix).M[9] = 0.0;
  (this->TextureFlipMatrix).M[10] = 0.0;
  (this->TextureFlipMatrix).M[0xb] = 0.0;
  (this->TextureFlipMatrix).M[0xc] = 0.0;
  (this->TextureFlipMatrix).M[5] = 0.0;
  (this->TextureFlipMatrix).M[6] = 0.0;
  (this->TextureFlipMatrix).M[7] = 0.0;
  (this->TextureFlipMatrix).M[8] = 0.0;
  (this->TextureFlipMatrix).M[0xd] = 0.0;
  (this->TextureFlipMatrix).M[0xe] = 0.0;
  (this->TextureFlipMatrix).M[1] = 0.0;
  (this->TextureFlipMatrix).M[2] = 0.0;
  (this->TextureFlipMatrix).M[3] = 0.0;
  (this->TextureFlipMatrix).M[4] = 0.0;
  (this->TextureFlipMatrix).M[0xf] = 1.0;
  (this->TextureFlipMatrix).M[10] = 1.0;
  (this->TextureFlipMatrix).M[5] = 1.0;
  (this->TextureFlipMatrix).M[0] = 1.0;
  this->ColorFormat = ECF_R8G8B8;
  this->FixedPipelineState = EOFPS_ENABLE;
  SIrrlichtCreationParameters::SIrrlichtCreationParameters(&this->Params,params);
  lVar2 = 0;
  do {
    *(undefined8 *)((long)&this->Quad2DVertices[0].Normal.Y + lVar2) = 0;
    puVar1 = (undefined8 *)((long)&this->Quad2DVertices[0].Pos.X + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)&this->Quad2DVertices[0].Color.color + lVar2) = 0xffffffff;
    *(undefined8 *)((long)&this->Quad2DVertices[0].TCoords.X + lVar2) = 0;
    lVar2 = lVar2 + 0x24;
  } while (lVar2 != 0x90);
  this->ContextManager = contextManager;
  return;
}

Assistant:

COpenGLDriver::COpenGLDriver(const SIrrlichtCreationParameters &params, io::IFileSystem *io, IContextManager *contextManager) :
		CNullDriver(io, params.WindowSize), COpenGLExtensionHandler(), CacheHandler(0), CurrentRenderMode(ERM_NONE), ResetRenderStates(true),
		Transformation3DChanged(true), AntiAlias(params.AntiAlias), ColorFormat(ECF_R8G8B8), FixedPipelineState(EOFPS_ENABLE), Params(params),
		ContextManager(contextManager)
{
#ifdef _DEBUG
	setDebugName("COpenGLDriver");
#endif
}